

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O1

void __thiscall QTextStream::setGenerateByteOrderMark(QTextStream *this,bool generate)

{
  QTextStreamPrivate *pQVar1;
  long in_FS_OFFSET;
  State local_48;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  if ((pQVar1->hasWrittenData == false) && (pQVar1->generateBOM != generate)) {
    pQVar1->generateBOM = generate;
    local_48.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)((uint)generate << 2);
    local_48.internalState = 0;
    local_48.remainingChars._0_4_ = 0;
    local_48.remainingChars._4_4_ = 0;
    local_48.invalidChars._0_4_ = 0;
    local_48.invalidChars._4_4_ = 0;
    local_48.field_4.state_data[0] = 0;
    local_48.field_4.state_data[1] = 0;
    local_48.field_4.state_data[2] = 0;
    local_48.field_4.state_data[3] = 0;
    local_48.clearFn = (ClearDataFn)0x0;
    (pQVar1->fromUtf16).super_QStringConverter.iface =
         QStringConverter::encodingInterfaces + pQVar1->encoding;
    QStringConverterBase::State::clear
              ((State *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 8));
    (((State *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 8))->flags).
    super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag> =
         (QFlagsStorage<QStringConverterBase::Flag>)
         local_48.flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
         super_QFlagsStorage<QStringConverterBase::Flag>.i;
    *(qsizetype *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x10) =
         CONCAT44(local_48.remainingChars._4_4_,(undefined4)local_48.remainingChars);
    *(qsizetype *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x18) =
         CONCAT44(local_48.invalidChars._4_4_,(undefined4)local_48.invalidChars);
    ((anon_union_16_2_cfafc8b3_for_State_4 *)
    ((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x20))->d[0] =
         (void *)CONCAT44(local_48.field_4.state_data[1],local_48.field_4.state_data[0]);
    *(ulong *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x28) =
         CONCAT44(local_48.field_4.state_data[3],local_48.field_4.state_data[2]);
    *(ClearDataFn *)((long)&(pQVar1->fromUtf16).super_QStringConverter + 0x30) = local_48.clearFn;
    local_48.clearFn = (ClearDataFn)0x0;
    QStringConverterBase::State::clear(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStream::setGenerateByteOrderMark(bool generate)
{
    Q_D(QTextStream);
    if (d->hasWrittenData || d->generateBOM == generate)
        return;

    d->generateBOM = generate;
    d->fromUtf16 = QStringEncoder(d->encoding, generate ? QStringConverter::Flag::WriteBom : QStringConverter::Flag::Default);
}